

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O2

Ivy_Obj_t * Dec_GraphToNetworkIvy(Ivy_Man_t *pMan,Dec_Graph_t *pGraph)

{
  uint uVar1;
  uint uVar2;
  Dec_Node_t *pDVar3;
  Ivy_Obj_t *pIVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *puVar7;
  anon_union_8_2_00c7e208_for_Dec_Node_t__2 *paVar8;
  
  if (pGraph->fConst == 0) {
    uVar6 = (ulong)(uint)pGraph->nLeaves;
    if (((uint)pGraph->eRoot >> 1 & 0x3fffffff) < (uint)pGraph->nLeaves) {
      pDVar3 = Dec_GraphVar(pGraph);
      paVar8 = &pDVar3->field_2;
    }
    else {
      lVar5 = uVar6 * 0x18;
      puVar7 = (undefined1 *)0x0;
      for (; (long)uVar6 < (long)pGraph->nSize; uVar6 = uVar6 + 1) {
        pDVar3 = pGraph->pNodes;
        puVar7 = &(pDVar3->eEdge0).field_0x0 + lVar5;
        uVar1 = *(uint *)(&(pDVar3->eEdge0).field_0x0 + lVar5);
        uVar2 = *(uint *)(&(pDVar3->eEdge1).field_0x0 + lVar5);
        pIVar4 = Ivy_And(pMan,(Ivy_Obj_t *)
                              ((ulong)(uVar1 & 1) ^
                              (ulong)pDVar3[uVar1 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Ivy_Obj_t *)
                         ((ulong)(uVar2 & 1) ^ (ulong)pDVar3[uVar2 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Ivy_Obj_t **)((long)&pDVar3->field_2 + lVar5) = pIVar4;
        lVar5 = lVar5 + 0x18;
      }
      paVar8 = (anon_union_8_2_00c7e208_for_Dec_Node_t__2 *)(puVar7 + 8);
    }
  }
  else {
    paVar8 = (anon_union_8_2_00c7e208_for_Dec_Node_t__2 *)&pMan->pConst1;
  }
  return (Ivy_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)paVar8->pFunc);
}

Assistant:

Ivy_Obj_t * Dec_GraphToNetworkIvy( Ivy_Man_t * pMan, Dec_Graph_t * pGraph )
{
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    Ivy_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Ivy_NotCond( Ivy_ManConst1(pMan), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Ivy_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Ivy_NotCond( (Ivy_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}